

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_optimize_for.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestOptionalOptimizedForSize::~TestOptionalOptimizedForSize
          (TestOptionalOptimizedForSize *this)

{
  TestOptionalOptimizedForSize *this_local;
  
  ~TestOptionalOptimizedForSize(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestOptionalOptimizedForSize::~TestOptionalOptimizedForSize() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestOptionalOptimizedForSize)
  SharedDtor(*this);
}